

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

int __thiscall OpenMD::Stats::getIntError(Stats *this,int index)

{
  Accumulator *this_00;
  RealType value;
  double local_10;
  
  this_00 = (Accumulator *)
            __dynamic_cast((this->data_).
                           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                           ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                           &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  Accumulator::get95percentConfidenceInterval(this_00,&local_10);
  return (int)local_10;
}

Assistant:

int Stats::getIntError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    RealType value;
    dynamic_cast<Accumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return (int)value;
  }